

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void gflags::anon_unknown_2::ParseFlagList
               (char *value,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *flags)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while ((value != (char *)0x0 && (cVar2 = *value, cVar2 != '\0'))) {
    pcVar1 = strchr(value,0x2c);
    if (pcVar1 == (char *)0x0) {
      sVar3 = strlen(value);
      pcVar1 = (char *)0x0;
    }
    else {
      sVar3 = (long)pcVar1 - (long)value;
      pcVar1 = pcVar1 + 1;
    }
    if (sVar3 == 0) {
      ReportError(DIE,"ERROR: empty flaglist entry\n");
      cVar2 = *value;
    }
    if (cVar2 == '-') {
      ReportError(DIE,"ERROR: flag \"%*s\" begins with \'-\'\n",sVar3,value);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,value,value + sVar3);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)flags,&local_50)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    value = pcVar1;
  }
  return;
}

Assistant:

static void ParseFlagList(const char* value, vector<string>* flags) {
  for (const char *p = value; p && *p; value = p) {
    p = strchr(value, ',');
    size_t len;
    if (p) {
      len = p - value;
      p++;
    } else {
      len = strlen(value);
    }

    if (len == 0)
      ReportError(DIE, "ERROR: empty flaglist entry\n");
    if (value[0] == '-')
      ReportError(DIE, "ERROR: flag \"%*s\" begins with '-'\n", len, value);

    flags->push_back(string(value, len));
  }
}